

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::InstanceArrayIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 (*pauVar5) [16];
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  Primitive *prim;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong unaff_R14;
  size_t mask;
  float fVar16;
  uint uVar17;
  float fVar26;
  float fVar28;
  vint4 bi;
  undefined1 auVar18 [16];
  uint uVar27;
  uint uVar29;
  float fVar30;
  uint uVar31;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  vint4 bi_1;
  float fVar35;
  float fVar36;
  uint uVar37;
  float fVar38;
  uint uVar39;
  float fVar40;
  uint uVar41;
  vint4 ai;
  float fVar42;
  uint uVar43;
  vint4 ai_1;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1031;
  ulong local_1030;
  ulong local_1028;
  ulong local_1020;
  uint local_1018 [4];
  ulong local_1008;
  ulong local_1000;
  undefined1 (*local_ff8) [16];
  ulong local_ff0;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_ff8 = (undefined1 (*) [16])local_f68;
      local_fb8 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_fc8 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_f88 = (ray->super_RayK<1>).org.field_0.m128[2];
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar33 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_f98 = 0.0;
      if (0.0 <= fVar33) {
        local_f98 = fVar33;
      }
      fVar33 = (ray->super_RayK<1>).tfar;
      fVar32 = 0.0;
      if (0.0 <= fVar33) {
        fVar32 = fVar33;
      }
      auVar18._4_4_ = -(uint)(ABS(aVar2.y) < DAT_01ff1d40._4_4_);
      auVar18._0_4_ = -(uint)(ABS(aVar2.x) < (float)DAT_01ff1d40);
      auVar18._8_4_ = -(uint)(ABS(aVar2.z) < DAT_01ff1d40._8_4_);
      auVar18._12_4_ = -(uint)(ABS(aVar2.field_3.w) < DAT_01ff1d40._12_4_);
      auVar44 = blendvps((undefined1  [16])aVar2,_DAT_01ff1d40,auVar18);
      auVar18 = rcpps(auVar18,auVar44);
      local_fd8 = auVar18._0_4_;
      local_fe8 = auVar18._4_4_;
      local_fa8 = auVar18._8_4_;
      local_fd8 = (1.0 - auVar44._0_4_ * local_fd8) * local_fd8 + local_fd8;
      local_fe8 = (1.0 - auVar44._4_4_ * local_fe8) * local_fe8 + local_fe8;
      local_fa8 = (1.0 - auVar44._8_4_ * local_fa8) * local_fa8 + local_fa8;
      local_1000 = (ulong)(local_fd8 < 0.0) << 4;
      local_1008 = (ulong)(local_fe8 < 0.0) << 4 | 0x20;
      local_1020 = (ulong)(local_fa8 < 0.0) << 4 | 0x40;
      local_1028 = local_1000 ^ 0x10;
      local_1030 = local_1008 ^ 0x10;
      local_ff0 = local_1020 ^ 0x10;
      fStack_f84 = local_f88;
      fStack_f80 = local_f88;
      fStack_f7c = local_f88;
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      fStack_fb4 = local_fb8;
      fStack_fb0 = local_fb8;
      fStack_fac = local_fb8;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      uVar9 = local_1008;
      uVar10 = local_1020;
      uVar11 = local_1028;
      uVar13 = local_1030;
      uVar14 = local_1000;
      fVar33 = fVar32;
      fVar34 = fVar32;
      fVar35 = fVar32;
      fVar52 = local_f88;
      fVar53 = local_f88;
      fVar54 = local_f88;
      fVar55 = local_f88;
      fVar56 = local_f98;
      fVar57 = local_f98;
      fVar58 = local_f98;
      fVar59 = local_f98;
      fVar60 = local_fa8;
      fVar61 = local_fa8;
      fVar62 = local_fa8;
      fVar63 = local_fa8;
      fVar64 = local_fb8;
      fVar65 = local_fb8;
      fVar66 = local_fb8;
      fVar67 = local_fb8;
      fVar68 = local_fc8;
      fVar69 = local_fc8;
      fVar70 = local_fc8;
      fVar71 = local_fc8;
      fVar72 = local_fd8;
      fVar73 = local_fd8;
      fVar74 = local_fd8;
      fVar75 = local_fd8;
      fVar76 = local_fe8;
      fVar77 = local_fe8;
      fVar78 = local_fe8;
      fVar79 = local_fe8;
      do {
        do {
          if (local_ff8 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar5 = local_ff8 + -1;
          local_ff8 = local_ff8 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar5 + 8));
        uVar8 = *(ulong *)*local_ff8;
        do {
          if ((uVar8 & 8) == 0) {
            pfVar1 = (float *)(uVar8 + 0x20 + uVar14);
            fVar16 = (*pfVar1 - fVar64) * fVar72;
            fVar26 = (pfVar1[1] - fVar65) * fVar73;
            fVar28 = (pfVar1[2] - fVar66) * fVar74;
            fVar30 = (pfVar1[3] - fVar67) * fVar75;
            pfVar1 = (float *)(uVar8 + 0x20 + uVar9);
            fVar36 = (*pfVar1 - fVar68) * fVar76;
            fVar38 = (pfVar1[1] - fVar69) * fVar77;
            fVar40 = (pfVar1[2] - fVar70) * fVar78;
            fVar42 = (pfVar1[3] - fVar71) * fVar79;
            uVar37 = (uint)((int)fVar36 < (int)fVar16) * (int)fVar16 |
                     (uint)((int)fVar36 >= (int)fVar16) * (int)fVar36;
            uVar39 = (uint)((int)fVar38 < (int)fVar26) * (int)fVar26 |
                     (uint)((int)fVar38 >= (int)fVar26) * (int)fVar38;
            uVar41 = (uint)((int)fVar40 < (int)fVar28) * (int)fVar28 |
                     (uint)((int)fVar40 >= (int)fVar28) * (int)fVar40;
            uVar43 = (uint)((int)fVar42 < (int)fVar30) * (int)fVar30 |
                     (uint)((int)fVar42 >= (int)fVar30) * (int)fVar42;
            pfVar1 = (float *)(uVar8 + 0x20 + uVar10);
            fVar16 = (*pfVar1 - fVar52) * fVar60;
            fVar26 = (pfVar1[1] - fVar53) * fVar61;
            fVar28 = (pfVar1[2] - fVar54) * fVar62;
            fVar30 = (pfVar1[3] - fVar55) * fVar63;
            uVar17 = (uint)((int)fVar16 < (int)fVar56) * (int)fVar56 |
                     (uint)((int)fVar16 >= (int)fVar56) * (int)fVar16;
            uVar27 = (uint)((int)fVar26 < (int)fVar57) * (int)fVar57 |
                     (uint)((int)fVar26 >= (int)fVar57) * (int)fVar26;
            uVar29 = (uint)((int)fVar28 < (int)fVar58) * (int)fVar58 |
                     (uint)((int)fVar28 >= (int)fVar58) * (int)fVar28;
            uVar31 = (uint)((int)fVar30 < (int)fVar59) * (int)fVar59 |
                     (uint)((int)fVar30 >= (int)fVar59) * (int)fVar30;
            local_1018[0] =
                 ((int)uVar17 < (int)uVar37) * uVar37 | ((int)uVar17 >= (int)uVar37) * uVar17;
            local_1018[1] =
                 ((int)uVar27 < (int)uVar39) * uVar39 | ((int)uVar27 >= (int)uVar39) * uVar27;
            local_1018[2] =
                 ((int)uVar29 < (int)uVar41) * uVar41 | ((int)uVar29 >= (int)uVar41) * uVar29;
            local_1018[3] =
                 ((int)uVar31 < (int)uVar43) * uVar43 | ((int)uVar31 >= (int)uVar43) * uVar31;
            pfVar1 = (float *)(uVar8 + 0x20 + uVar11);
            fVar16 = (*pfVar1 - fVar64) * fVar72;
            fVar26 = (pfVar1[1] - fVar65) * fVar73;
            fVar28 = (pfVar1[2] - fVar66) * fVar74;
            fVar30 = (pfVar1[3] - fVar67) * fVar75;
            pfVar1 = (float *)(uVar8 + 0x20 + uVar13);
            fVar36 = (*pfVar1 - fVar68) * fVar76;
            fVar38 = (pfVar1[1] - fVar69) * fVar77;
            fVar40 = (pfVar1[2] - fVar70) * fVar78;
            fVar42 = (pfVar1[3] - fVar71) * fVar79;
            uVar37 = (uint)((int)fVar16 < (int)fVar36) * (int)fVar16 |
                     (uint)((int)fVar16 >= (int)fVar36) * (int)fVar36;
            uVar39 = (uint)((int)fVar26 < (int)fVar38) * (int)fVar26 |
                     (uint)((int)fVar26 >= (int)fVar38) * (int)fVar38;
            uVar41 = (uint)((int)fVar28 < (int)fVar40) * (int)fVar28 |
                     (uint)((int)fVar28 >= (int)fVar40) * (int)fVar40;
            uVar43 = (uint)((int)fVar30 < (int)fVar42) * (int)fVar30 |
                     (uint)((int)fVar30 >= (int)fVar42) * (int)fVar42;
            pfVar1 = (float *)(uVar8 + 0x20 + local_ff0);
            fVar16 = (*pfVar1 - fVar52) * fVar60;
            fVar26 = (pfVar1[1] - fVar53) * fVar61;
            fVar28 = (pfVar1[2] - fVar54) * fVar62;
            fVar30 = (pfVar1[3] - fVar55) * fVar63;
            uVar17 = (uint)((int)fVar32 < (int)fVar16) * (int)fVar32 |
                     (uint)((int)fVar32 >= (int)fVar16) * (int)fVar16;
            uVar27 = (uint)((int)fVar33 < (int)fVar26) * (int)fVar33 |
                     (uint)((int)fVar33 >= (int)fVar26) * (int)fVar26;
            uVar29 = (uint)((int)fVar34 < (int)fVar28) * (int)fVar34 |
                     (uint)((int)fVar34 >= (int)fVar28) * (int)fVar28;
            uVar31 = (uint)((int)fVar35 < (int)fVar30) * (int)fVar35 |
                     (uint)((int)fVar35 >= (int)fVar30) * (int)fVar30;
            auVar44._0_4_ =
                 -(uint)((int)(((int)uVar37 < (int)uVar17) * uVar37 |
                              ((int)uVar37 >= (int)uVar17) * uVar17) < (int)local_1018[0]);
            auVar44._4_4_ =
                 -(uint)((int)(((int)uVar39 < (int)uVar27) * uVar39 |
                              ((int)uVar39 >= (int)uVar27) * uVar27) < (int)local_1018[1]);
            auVar44._8_4_ =
                 -(uint)((int)(((int)uVar41 < (int)uVar29) * uVar41 |
                              ((int)uVar41 >= (int)uVar29) * uVar29) < (int)local_1018[2]);
            auVar44._12_4_ =
                 -(uint)((int)(((int)uVar43 < (int)uVar31) * uVar43 |
                              ((int)uVar43 >= (int)uVar31) * uVar31) < (int)local_1018[3]);
            uVar17 = movmskps((int)local_ff0,auVar44);
            unaff_R14 = ((ulong)uVar17 ^ 0xf) & 0xff;
          }
          if ((uVar8 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar6 = 4;
            }
            else {
              uVar7 = uVar8 & 0xfffffffffffffff0;
              lVar15 = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                }
              }
              iVar6 = 0;
              uVar8 = *(ulong *)(uVar7 + lVar15 * 8);
              uVar12 = unaff_R14 - 1 & unaff_R14;
              if (uVar12 != 0) {
                uVar17 = local_1018[lVar15];
                lVar15 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                  }
                }
                uVar3 = *(ulong *)(uVar7 + lVar15 * 8);
                uVar27 = local_1018[lVar15];
                uVar12 = uVar12 - 1 & uVar12;
                uVar10 = local_1020;
                uVar11 = local_1028;
                uVar13 = local_1030;
                if (uVar12 == 0) {
                  if (uVar17 < uVar27) {
                    *(ulong *)*local_ff8 = uVar3;
                    *(uint *)((long)*local_ff8 + 8) = uVar27;
                    local_ff8 = local_ff8 + 1;
                  }
                  else {
                    *(ulong *)*local_ff8 = uVar8;
                    *(uint *)((long)*local_ff8 + 8) = uVar17;
                    uVar8 = uVar3;
                    local_ff8 = local_ff8 + 1;
                  }
                }
                else {
                  auVar46._8_4_ = uVar17;
                  auVar46._0_8_ = uVar8;
                  auVar46._12_4_ = 0;
                  auVar49._8_4_ = uVar27;
                  auVar49._0_8_ = uVar3;
                  auVar49._12_4_ = 0;
                  lVar15 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                    }
                  }
                  uVar4 = *(undefined8 *)(uVar7 + lVar15 * 8);
                  uVar29 = local_1018[lVar15];
                  auVar51._8_4_ = uVar29;
                  auVar51._0_8_ = uVar4;
                  auVar51._12_4_ = 0;
                  auVar47._8_4_ = -(uint)((int)uVar17 < (int)uVar27);
                  uVar12 = uVar12 - 1 & uVar12;
                  if (uVar12 == 0) {
                    auVar47._4_4_ = auVar47._8_4_;
                    auVar47._0_4_ = auVar47._8_4_;
                    auVar47._12_4_ = auVar47._8_4_;
                    auVar45._8_4_ = uVar27;
                    auVar45._0_8_ = uVar3;
                    auVar45._12_4_ = 0;
                    auVar44 = blendvps(auVar45,auVar46,auVar47);
                    auVar18 = blendvps(auVar46,auVar49,auVar47);
                    auVar19._8_4_ = -(uint)(auVar44._8_4_ < (int)uVar29);
                    auVar19._4_4_ = auVar19._8_4_;
                    auVar19._0_4_ = auVar19._8_4_;
                    auVar19._12_4_ = auVar19._8_4_;
                    auVar48._8_4_ = uVar29;
                    auVar48._0_8_ = uVar4;
                    auVar48._12_4_ = 0;
                    auVar49 = blendvps(auVar48,auVar44,auVar19);
                    auVar46 = blendvps(auVar44,auVar51,auVar19);
                    auVar20._8_4_ = -(uint)(auVar18._8_4_ < auVar46._8_4_);
                    auVar20._4_4_ = auVar20._8_4_;
                    auVar20._0_4_ = auVar20._8_4_;
                    auVar20._12_4_ = auVar20._8_4_;
                    auVar44 = blendvps(auVar46,auVar18,auVar20);
                    auVar18 = blendvps(auVar18,auVar46,auVar20);
                    *local_ff8 = auVar18;
                    local_ff8[1] = auVar44;
                    uVar8 = auVar49._0_8_;
                    local_ff8 = local_ff8 + 2;
                  }
                  else {
                    lVar15 = 0;
                    if (uVar12 != 0) {
                      for (; (uVar12 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                      }
                    }
                    auVar21._4_4_ = auVar47._8_4_;
                    auVar21._0_4_ = auVar47._8_4_;
                    auVar21._8_4_ = auVar47._8_4_;
                    auVar21._12_4_ = auVar47._8_4_;
                    auVar47 = blendvps(auVar49,auVar46,auVar21);
                    auVar18 = blendvps(auVar46,auVar49,auVar21);
                    auVar50._8_4_ = local_1018[lVar15];
                    auVar50._0_8_ = *(undefined8 *)(uVar7 + lVar15 * 8);
                    auVar50._12_4_ = 0;
                    auVar22._8_4_ = -(uint)((int)uVar29 < (int)local_1018[lVar15]);
                    auVar22._4_4_ = auVar22._8_4_;
                    auVar22._0_4_ = auVar22._8_4_;
                    auVar22._12_4_ = auVar22._8_4_;
                    auVar46 = blendvps(auVar50,auVar51,auVar22);
                    auVar44 = blendvps(auVar51,auVar50,auVar22);
                    auVar23._8_4_ = -(uint)(auVar18._8_4_ < auVar44._8_4_);
                    auVar23._4_4_ = auVar23._8_4_;
                    auVar23._0_4_ = auVar23._8_4_;
                    auVar23._12_4_ = auVar23._8_4_;
                    auVar51 = blendvps(auVar44,auVar18,auVar23);
                    auVar18 = blendvps(auVar18,auVar44,auVar23);
                    auVar24._8_4_ = -(uint)(auVar47._8_4_ < auVar46._8_4_);
                    auVar24._4_4_ = auVar24._8_4_;
                    auVar24._0_4_ = auVar24._8_4_;
                    auVar24._12_4_ = auVar24._8_4_;
                    auVar44 = blendvps(auVar46,auVar47,auVar24);
                    auVar46 = blendvps(auVar47,auVar46,auVar24);
                    auVar25._8_4_ = -(uint)(auVar46._8_4_ < auVar51._8_4_);
                    auVar25._4_4_ = auVar25._8_4_;
                    auVar25._0_4_ = auVar25._8_4_;
                    auVar25._12_4_ = auVar25._8_4_;
                    auVar49 = blendvps(auVar51,auVar46,auVar25);
                    auVar46 = blendvps(auVar46,auVar51,auVar25);
                    *local_ff8 = auVar18;
                    local_ff8[1] = auVar46;
                    local_ff8[2] = auVar49;
                    uVar8 = auVar44._0_8_;
                    local_ff8 = local_ff8 + 3;
                  }
                }
              }
            }
          }
          else {
            iVar6 = 6;
          }
        } while (iVar6 == 0);
        if (iVar6 == 6) {
          lVar15 = (ulong)((uint)uVar8 & 0xf) - 8;
          if (lVar15 != 0) {
            prim = (Primitive *)(uVar8 & 0xfffffffffffffff0);
            do {
              InstanceArrayIntersector1::intersect(&local_1031,ray,context,prim);
              prim = prim + 1;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
          }
          fVar32 = (ray->super_RayK<1>).tfar;
          uVar9 = local_1008;
          uVar10 = local_1020;
          uVar11 = local_1028;
          uVar13 = local_1030;
          uVar14 = local_1000;
          fVar33 = fVar32;
          fVar34 = fVar32;
          fVar35 = fVar32;
          fVar52 = local_f88;
          fVar53 = fStack_f84;
          fVar54 = fStack_f80;
          fVar55 = fStack_f7c;
          fVar56 = local_f98;
          fVar57 = fStack_f94;
          fVar58 = fStack_f90;
          fVar59 = fStack_f8c;
          fVar60 = local_fa8;
          fVar61 = fStack_fa4;
          fVar62 = fStack_fa0;
          fVar63 = fStack_f9c;
          fVar64 = local_fb8;
          fVar65 = fStack_fb4;
          fVar66 = fStack_fb0;
          fVar67 = fStack_fac;
          fVar68 = local_fc8;
          fVar69 = fStack_fc4;
          fVar70 = fStack_fc0;
          fVar71 = fStack_fbc;
          fVar72 = local_fd8;
          fVar73 = fStack_fd4;
          fVar74 = fStack_fd0;
          fVar75 = fStack_fcc;
          fVar76 = local_fe8;
          fVar77 = fStack_fe4;
          fVar78 = fStack_fe0;
          fVar79 = fStack_fdc;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }